

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

bool __thiscall
libchars::command_cursor::command(command_cursor *this,filter_t mask,bool ignore_hidden)

{
  _Elt_pointer ppcVar1;
  _Elt_pointer ppcVar2;
  command_node **ppcVar3;
  _Elt_pointer ppcVar4;
  
  ppcVar1 = (this->S).c.
            super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  ppcVar2 = (this->S).c.
            super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppcVar2 == ppcVar1) {
    ppcVar3 = &this->root;
  }
  else {
    ppcVar4 = ppcVar2;
    if (ppcVar2 ==
        (this->S).c.
        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppcVar4 = (this->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppcVar3 = ppcVar4 + -1;
  }
  if (*ppcVar3 != (command_node *)0x0) {
    if (ppcVar2 == ppcVar1) {
      ppcVar3 = &this->root;
    }
    else {
      ppcVar4 = ppcVar2;
      if (ppcVar2 ==
          (this->S).c.
          super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppcVar4 = (this->S).c.
                  super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      ppcVar3 = ppcVar4 + -1;
    }
    if (((*ppcVar3)->mask & mask) != 0) {
      if (ppcVar2 == ppcVar1) {
        ppcVar3 = &this->root;
      }
      else {
        ppcVar4 = ppcVar2;
        if (ppcVar2 ==
            (this->S).c.
            super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppcVar4 = (this->S).c.
                    super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        ppcVar3 = ppcVar4 + -1;
      }
      if ((byte)((*ppcVar3)->hidden ^ 1U | ignore_hidden) == 1) {
        if (ppcVar2 == ppcVar1) {
          ppcVar3 = &this->root;
        }
        else {
          ppcVar4 = ppcVar2;
          if (ppcVar2 ==
              (this->S).c.
              super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppcVar4 = (this->S).c.
                      super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          ppcVar3 = ppcVar4 + -1;
        }
        if ((*ppcVar3)->cmd != (command *)0x0) {
          if (ppcVar2 == ppcVar1) {
            ppcVar3 = &this->root;
          }
          else {
            ppcVar4 = ppcVar2;
            if (ppcVar2 ==
                (this->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppcVar4 = (this->S).c.
                        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
            }
            ppcVar3 = ppcVar4 + -1;
          }
          if (((*ppcVar3)->cmd->mask & mask) != 0) {
            if (ppcVar2 == ppcVar1) {
              ppcVar3 = &this->root;
            }
            else {
              if (ppcVar2 ==
                  (this->S).c.
                  super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppcVar2 = (this->S).c.
                          super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
              }
              ppcVar3 = ppcVar2 + -1;
            }
            return (bool)((*ppcVar3)->cmd->hidden ^ 1U | ignore_hidden);
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool command_cursor::command(command::filter_t mask, bool ignore_hidden) const
    {
        return valid() &&
               (current()->mask & mask) != 0 &&
               (!current()->hidden || ignore_hidden) &&
               current()->cmd != NULL &&
               (current()->cmd->mask & mask) != 0 &&
               (!current()->cmd->hidden || ignore_hidden);
    }